

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yy.c
# Opt level: O0

void yy_lex_common(yy_lex_intern *x,envy_loc *loc,char *str)

{
  int local_24;
  int i;
  char *str_local;
  envy_loc *loc_local;
  yy_lex_intern *x_local;
  
  loc->lstart = x->line;
  loc->cstart = x->pos;
  for (local_24 = 0; str[local_24] != '\0'; local_24 = local_24 + 1) {
    if (str[local_24] == '\n') {
      x->pos = 1;
      x->line = x->line + 1;
    }
    else {
      x->pos = x->pos + 1;
    }
  }
  loc->lend = x->line;
  loc->cend = x->pos;
  loc->file = x->file;
  return;
}

Assistant:

void yy_lex_common(struct yy_lex_intern *x, YYLTYPE *loc, const char *str) {
	int i;
	loc->lstart = x->line;
	loc->cstart = x->pos;
	for (i = 0; str[i]; i++) {
		if (str[i] == '\n') {
			x->pos = 1;
			x->line++;
		} else {
			x->pos++;
		}
	}
	loc->lend = x->line;
	loc->cend = x->pos;
	loc->file = x->file;
}